

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall obs::safe_list<obs::slot<void_()>_>::node::lock(node *this,iterator *it)

{
  bool bVar1;
  iterator *it_local;
  node *this_local;
  
  this->locks = this->locks + 1;
  if (this->locks < 1) {
    __assert_fail("locks > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0x196,
                  "void obs::safe_list<obs::slot<void ()>>::node::lock(iterator *) [T = obs::slot<void ()>]"
                 );
  }
  bVar1 = in_creator_thread(this);
  if (bVar1) {
    it->m_next_iterator = this->creator_thread_iterator;
    this->creator_thread_iterator = it;
  }
  return;
}

Assistant:

void safe_list<T>::node::lock(iterator* it) {
  ++locks;
  assert(locks > 0);

  // If we are in the creator thread, we add this iterator in the
  // "creator thread iterators" linked-list so the iterator is
  // notified in case that the node is erased.
  if (in_creator_thread()) {
    it->m_next_iterator = creator_thread_iterator;
    creator_thread_iterator = it;
  }
}